

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O1

void __thiscall
fmt::v11::detail::parse_format_string<char,fmt::v11::detail::format_handler<char>>
          (detail *this,basic_string_view<char> fmt,format_handler<char> *handler)

{
  detail *end;
  undefined1 value [16];
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  undefined1 value_02 [16];
  basic_appender<char> out;
  basic_appender<char> out_00;
  basic_appender<char> out_01;
  basic_appender<char> out_02;
  detail *begin;
  detail *pdVar1;
  format_handler<char> *this_00;
  basic_appender<char> bVar2;
  int iVar3;
  detail *pdVar4;
  detail dVar5;
  format_specs specs;
  format_specs specs_00;
  longdouble in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff52;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_a8;
  int local_98;
  format_specs local_80;
  undefined8 uStack_70;
  undefined8 local_68;
  basic_format_args<fmt::v11::context> *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  id_adapter local_40;
  
  this_00 = (format_handler<char> *)fmt.size_;
  end = this + (long)fmt.data_;
  if (fmt.data_ != (char *)0x0) {
    local_60 = &(this_00->ctx).args_;
    pdVar1 = this;
    do {
      begin = pdVar1 + 1;
      if (*pdVar1 == (detail)0x7d) {
        if ((begin == end) || (*begin != (detail)0x7d)) {
          report_error("unmatched \'}\' in format string");
        }
        bVar2.container = (this_00->ctx).out_.container;
LAB_0015bd78:
        copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
                  ((char *)this,(char *)begin,bVar2);
LAB_0015bd7d:
        this = pdVar1 + 2;
        pdVar4 = this;
      }
      else {
        pdVar4 = begin;
        if (*pdVar1 == (detail)0x7b) {
          copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
                    ((char *)this,(char *)pdVar1,(this_00->ctx).out_.container);
          if (begin == end) {
            report_error("invalid format string");
          }
          dVar5 = *begin;
          if (dVar5 == (detail)0x3a) {
            iVar3 = (this_00->parse_ctx).next_arg_id_;
            if (iVar3 < 0) {
LAB_0015c20c:
              report_error("cannot switch from manual to automatic argument indexing");
            }
            (this_00->parse_ctx).next_arg_id_ = iVar3 + 1;
LAB_0015c19a:
            pdVar1 = (detail *)
                     format_handler<char>::on_format_specs
                               (this_00,iVar3,(char *)(begin + 1),(char *)end);
            if ((pdVar1 == end) || (*pdVar1 != (detail)0x7d)) {
              report_error("unknown format specifier");
            }
            this = pdVar1 + 1;
            pdVar4 = this;
          }
          else if (dVar5 == (detail)0x7b) {
            this = pdVar1 + 2;
            copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
                      ((char *)begin,(char *)this,(this_00->ctx).out_.container);
            pdVar4 = this;
          }
          else {
            if (dVar5 == (detail)0x7d) {
              iVar3 = (this_00->parse_ctx).next_arg_id_;
              if (iVar3 < 0) goto LAB_0015c20c;
              (this_00->parse_ctx).next_arg_id_ = iVar3 + 1;
              basic_format_args<fmt::v11::context>::get
                        ((format_arg *)&local_a8.string,local_60,iVar3);
              if (0xe < local_98 - 1U) goto LAB_0015c224;
              bVar2.container = (this_00->ctx).out_.container;
              switch(local_98) {
              case 1:
                write<char,_fmt::v11::basic_appender<char>,_int,_0>(bVar2,local_a8.int_value);
                break;
              case 2:
                write<char,_fmt::v11::basic_appender<char>,_unsigned_int,_0>
                          (bVar2,local_a8.uint_value);
                break;
              case 3:
                write<char,_fmt::v11::basic_appender<char>,_long_long,_0>
                          (bVar2,CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value));
                break;
              case 4:
                write<char,_fmt::v11::basic_appender<char>,_unsigned_long_long,_0>
                          (bVar2,CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value));
                break;
              case 5:
                out.container._4_4_ = local_a8.long_long_value._4_4_;
                out.container._0_4_ = local_a8.int_value;
                value._10_6_ = in_stack_ffffffffffffff52;
                value._0_10_ = in_stack_ffffffffffffff48;
                write<char,_fmt::v11::basic_appender<char>,___int128,_0>
                          ((detail *)bVar2.container,out,(__int128)value);
                break;
              case 6:
                out_00.container._4_4_ = local_a8.long_long_value._4_4_;
                out_00.container._0_4_ = local_a8.int_value;
                value_00._10_6_ = in_stack_ffffffffffffff52;
                value_00._0_10_ = in_stack_ffffffffffffff48;
                write<char,_fmt::v11::basic_appender<char>,_unsigned___int128,_0>
                          ((detail *)bVar2.container,out_00,(unsigned___int128)value_00);
                break;
              case 7:
                local_80.super_basic_specs.data_ = 0x8000;
                local_80.super_basic_specs.fill_data_[0] = ' ';
                local_80.super_basic_specs.fill_data_[1] = '\0';
                local_80.super_basic_specs.fill_data_[2] = '\0';
                local_80.super_basic_specs.fill_data_[3] = '\0';
                local_80.width = 0;
                local_80.precision = -1;
                write<char,_fmt::v11::basic_appender<char>,_bool,_0>
                          (bVar2,local_a8.bool_value,&local_80,(locale_ref)0x0);
                break;
              case 8:
                write<char,fmt::v11::basic_appender<char>>(bVar2,local_a8.char_value);
                break;
              case 9:
                write<char,_fmt::v11::basic_appender<char>,_float,_0>(bVar2,local_a8.float_value);
                break;
              case 10:
                write<char,_fmt::v11::basic_appender<char>,_double,_0>
                          (bVar2,(double)CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value)
                          );
                break;
              case 0xb:
                in_stack_ffffffffffffff48 =
                     (longdouble)
                     CONCAT28(local_a8.int128_value._8_2_,
                              CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value));
                specs.width = 0;
                specs.precision = -1;
                specs.super_basic_specs.data_ = 0x8000;
                specs.super_basic_specs.fill_data_[0] = ' ';
                specs.super_basic_specs.fill_data_[1] = '\0';
                specs.super_basic_specs.fill_data_[2] = '\0';
                specs.super_basic_specs.fill_data_[3] = '\0';
                write<char,_fmt::v11::basic_appender<char>,_long_double,_0>
                          (bVar2,in_stack_ffffffffffffff48,specs,(locale_ref)0x0);
                break;
              case 0xc:
                write<char,fmt::v11::basic_appender<char>>
                          (bVar2,(char *)CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value)
                          );
                break;
              case 0xd:
                this = (detail *)CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value);
                begin = this + CONCAT62(local_a8.int128_value._10_6_,local_a8.int128_value._8_2_);
                goto LAB_0015bd78;
              case 0xe:
                local_80.super_basic_specs.data_ = 0x8000;
                local_80.super_basic_specs.fill_data_[0] = ' ';
                local_80.super_basic_specs.fill_data_[1] = '\0';
                local_80.super_basic_specs.fill_data_[2] = '\0';
                local_80.super_basic_specs.fill_data_[3] = '\0';
                local_80.width = 0;
                local_80.precision = -1;
                write_ptr<char,fmt::v11::basic_appender<char>,unsigned_long>
                          (bVar2,CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value),
                           &local_80);
                break;
              case 0xf:
                local_58 = 0;
                uStack_50 = 0;
                local_48 = 0;
                local_80.super_basic_specs.data_ = (uint)bVar2.container;
                local_80.super_basic_specs.fill_data_ = SUB84((ulong)bVar2.container >> 0x20,0);
                local_80.width = 0;
                local_80.precision = 0;
                uStack_70 = 0;
                local_68 = 0;
                (*(code *)CONCAT62(local_a8.int128_value._10_6_,local_a8.int128_value._8_2_))
                          (CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value),&local_58,
                           &local_80);
              }
              goto LAB_0015bd7d;
            }
            local_40.arg_id = 0;
            local_40.handler = this_00;
            begin = (detail *)
                    parse_arg_id<char,fmt::v11::detail::parse_replacement_field<char,fmt::v11::detail::format_handler<char>&>(char_const*,char_const*,fmt::v11::detail::format_handler<char>&)::id_adapter&>
                              ((char *)begin,(char *)end,&local_40);
            iVar3 = local_40.arg_id;
            if (begin == end) {
              dVar5 = (detail)0x0;
            }
            else {
              dVar5 = *begin;
            }
            if (dVar5 == (detail)0x7d) {
              basic_format_args<fmt::v11::context>::get
                        ((format_arg *)&local_a8.string,local_60,local_40.arg_id);
              if (0xe < local_98 - 1U) {
LAB_0015c224:
                report_error("argument not found");
              }
              bVar2.container = (this_00->ctx).out_.container;
              switch(local_98) {
              case 1:
                write<char,_fmt::v11::basic_appender<char>,_int,_0>(bVar2,local_a8.int_value);
                break;
              case 2:
                write<char,_fmt::v11::basic_appender<char>,_unsigned_int,_0>
                          (bVar2,local_a8.uint_value);
                break;
              case 3:
                write<char,_fmt::v11::basic_appender<char>,_long_long,_0>
                          (bVar2,CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value));
                break;
              case 4:
                write<char,_fmt::v11::basic_appender<char>,_unsigned_long_long,_0>
                          (bVar2,CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value));
                break;
              case 5:
                out_01.container._4_4_ = local_a8.long_long_value._4_4_;
                out_01.container._0_4_ = local_a8.int_value;
                value_01._10_6_ = in_stack_ffffffffffffff52;
                value_01._0_10_ = in_stack_ffffffffffffff48;
                write<char,_fmt::v11::basic_appender<char>,___int128,_0>
                          ((detail *)bVar2.container,out_01,(__int128)value_01);
                break;
              case 6:
                out_02.container._4_4_ = local_a8.long_long_value._4_4_;
                out_02.container._0_4_ = local_a8.int_value;
                value_02._10_6_ = in_stack_ffffffffffffff52;
                value_02._0_10_ = in_stack_ffffffffffffff48;
                write<char,_fmt::v11::basic_appender<char>,_unsigned___int128,_0>
                          ((detail *)bVar2.container,out_02,(unsigned___int128)value_02);
                break;
              case 7:
                local_80.super_basic_specs.data_ = 0x8000;
                local_80.super_basic_specs.fill_data_[0] = ' ';
                local_80.super_basic_specs.fill_data_[1] = '\0';
                local_80.super_basic_specs.fill_data_[2] = '\0';
                local_80.super_basic_specs.fill_data_[3] = '\0';
                local_80.width = 0;
                local_80.precision = -1;
                write<char,_fmt::v11::basic_appender<char>,_bool,_0>
                          (bVar2,local_a8.bool_value,&local_80,(locale_ref)0x0);
                break;
              case 8:
                write<char,fmt::v11::basic_appender<char>>(bVar2,local_a8.char_value);
                break;
              case 9:
                write<char,_fmt::v11::basic_appender<char>,_float,_0>(bVar2,local_a8.float_value);
                break;
              case 10:
                write<char,_fmt::v11::basic_appender<char>,_double,_0>
                          (bVar2,(double)CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value)
                          );
                break;
              case 0xb:
                in_stack_ffffffffffffff48 =
                     (longdouble)
                     CONCAT28(local_a8.int128_value._8_2_,
                              CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value));
                specs_00.width = 0;
                specs_00.precision = -1;
                specs_00.super_basic_specs.data_ = 0x8000;
                specs_00.super_basic_specs.fill_data_[0] = ' ';
                specs_00.super_basic_specs.fill_data_[1] = '\0';
                specs_00.super_basic_specs.fill_data_[2] = '\0';
                specs_00.super_basic_specs.fill_data_[3] = '\0';
                write<char,_fmt::v11::basic_appender<char>,_long_double,_0>
                          (bVar2,in_stack_ffffffffffffff48,specs_00,(locale_ref)0x0);
                break;
              case 0xc:
                write<char,fmt::v11::basic_appender<char>>
                          (bVar2,(char *)CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value)
                          );
                break;
              case 0xd:
                copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
                          ((char *)CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value),
                           (char *)CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value) +
                           CONCAT62(local_a8.int128_value._10_6_,local_a8.int128_value._8_2_),bVar2)
                ;
                break;
              case 0xe:
                local_80.super_basic_specs.data_ = 0x8000;
                local_80.super_basic_specs.fill_data_[0] = ' ';
                local_80.super_basic_specs.fill_data_[1] = '\0';
                local_80.super_basic_specs.fill_data_[2] = '\0';
                local_80.super_basic_specs.fill_data_[3] = '\0';
                local_80.width = 0;
                local_80.precision = -1;
                write_ptr<char,fmt::v11::basic_appender<char>,unsigned_long>
                          (bVar2,CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value),
                           &local_80);
                break;
              case 0xf:
                local_58 = 0;
                uStack_50 = 0;
                local_48 = 0;
                local_80.super_basic_specs.data_ = (uint)bVar2.container;
                local_80.super_basic_specs.fill_data_ = SUB84((ulong)bVar2.container >> 0x20,0);
                local_80.width = 0;
                local_80.precision = 0;
                uStack_70 = 0;
                local_68 = 0;
                (*(code *)CONCAT62(local_a8.int128_value._10_6_,local_a8.int128_value._8_2_))
                          (CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value),&local_58,
                           &local_80);
              }
              this = begin + 1;
            }
            else {
              this = pdVar1;
              if (dVar5 != (detail)0x3a) {
                report_error("missing \'}\' in format string");
              }
            }
            pdVar4 = this;
            if (dVar5 != (detail)0x7d) goto LAB_0015c19a;
          }
        }
      }
      pdVar1 = pdVar4;
    } while (pdVar4 != end);
  }
  copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
            ((char *)this,(char *)end,(this_00->ctx).out_.container);
  return;
}

Assistant:

FMT_CONSTEXPR void parse_format_string(basic_string_view<Char> fmt,
                                       Handler&& handler) {
  auto begin = fmt.data(), end = begin + fmt.size();
  auto p = begin;
  while (p != end) {
    auto c = *p++;
    if (c == '{') {
      handler.on_text(begin, p - 1);
      begin = p = parse_replacement_field(p - 1, end, handler);
    } else if (c == '}') {
      if (p == end || *p != '}')
        return handler.on_error("unmatched '}' in format string");
      handler.on_text(begin, p);
      begin = ++p;
    }
  }
  handler.on_text(begin, end);
}